

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O2

bool gguf_read_emplace_helper<float>
               (gguf_reader *gr,vector<gguf_kv,_std::allocator<gguf_kv>_> *kv,string *key,
               bool is_array,size_t n)

{
  bool bVar1;
  undefined3 in_register_00000009;
  vector<float,_std::allocator<float>_> value;
  _Vector_base<float,_std::allocator<float>_> local_28;
  
  if (CONCAT31(in_register_00000009,is_array) == 0) {
    bVar1 = gguf_reader::read<float>(gr,(float *)&local_28);
    if (!bVar1) {
      return false;
    }
    std::vector<gguf_kv,std::allocator<gguf_kv>>::emplace_back<std::__cxx11::string_const&,float&>
              ((vector<gguf_kv,std::allocator<gguf_kv>> *)kv,key,(float *)&local_28);
  }
  else {
    local_28._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_28._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_28._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = gguf_reader::read<float>(gr,(vector<float,_std::allocator<float>_> *)&local_28,n);
    if (!bVar1) {
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_28);
      return false;
    }
    std::vector<gguf_kv,std::allocator<gguf_kv>>::
    emplace_back<std::__cxx11::string_const&,std::vector<float,std::allocator<float>>&>
              ((vector<gguf_kv,std::allocator<gguf_kv>> *)kv,key,
               (vector<float,_std::allocator<float>_> *)&local_28);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_28);
  }
  return true;
}

Assistant:

bool gguf_read_emplace_helper(const struct gguf_reader & gr, std::vector<struct gguf_kv> & kv, const std::string & key, const bool is_array, const size_t n) {
    if (is_array) {
        std::vector<T> value;
        try {
            if (!gr.read(value, n)) {
                return false;
            }
        } catch (std::length_error &) {
            fprintf(stderr, "%s: encountered length_error while reading value for key '%s'\n", __func__, key.c_str());
            return false;
        } catch (std::bad_alloc &) {
            fprintf(stderr, "%s: encountered bad_alloc error while reading value for key '%s'\n", __func__, key.c_str());
            return false;
        }
        kv.emplace_back(key, value);
    } else {
        T value;
        if (!gr.read(value)) {
            return false;
        }
        kv.emplace_back(key, value);
    }
    return true;
}